

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

void __thiscall mir::inst::MirFunction::MirFunction(MirFunction *this,MirFunction *other)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001db488;
  std::__cxx11::string::string((string *)&this->name,(string *)&other->name);
  (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (other->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (other->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (other->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (other->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->variables)._M_t._M_impl.super__Rb_tree_header,
             &(other->variables)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->basic_blks)._M_t._M_impl.super__Rb_tree_header,
             &(other->basic_blks)._M_t._M_impl.super__Rb_tree_header);
  return;
}

Assistant:

MirFunction(MirFunction&& other) = default;